

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  undefined1 local_2c [8];
  Helper h;
  int n_d;
  int n_p;
  char **argv_local;
  int argc_local;
  
  h.count = 0;
  h.d_size = 0;
  std::operator<<((ostream *)&std::cout,"\nPlease input program size: ");
  std::istream::operator>>((istream *)&std::cin,&h.count);
  std::operator<<((ostream *)&std::cout,"\nPlease input data size: ");
  std::istream::operator>>((istream *)&std::cin,&h.d_size);
  if ((h.count < 1) || (h.d_size < 1)) {
    this = std::operator<<((ostream *)&std::cout,"\nInvalid input! Terminating...");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    Helper::Helper((Helper *)local_2c,h.count,h.d_size,1000);
    Helper::Init((Helper *)local_2c);
    Helper::~Helper((Helper *)local_2c);
  }
  return 0;
}

Assistant:

int main(int argc, char const *argv[]) 
{ 
	int n_p = 0;
    int n_d = 0;
    cout<<"\nPlease input program size: ";
    cin>> n_p;
    cout<<"\nPlease input data size: ";
    cin>> n_d;
    if(n_p > 0 && n_d > 0)
    {
        Helper h(n_p, n_d, 1000);
	    h.Init();
    }
    else
        cout<<"\nInvalid input! Terminating..."<<endl;
        
	return 0; 
}